

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O3

_Bool eddsa_verify(ssh_key *key,ptrlen sig,ptrlen data)

{
  eddsa_key *ek;
  ecsign_extra *extra;
  EdwardsPoint *ep;
  _Bool _Var1;
  uint uVar2;
  mp_int *n;
  mp_int *n_00;
  EdwardsPoint *P;
  EdwardsPoint *Q;
  EdwardsPoint *Q_00;
  ptrlen pVar3;
  ptrlen pVar4;
  BinarySource src [1];
  BinarySource local_78;
  EdwardsPoint *local_48;
  size_t local_40;
  void *local_38;
  
  local_78.len = sig.len;
  local_78.data = sig.ptr;
  extra = (ecsign_extra *)key->vt->extra;
  local_78.pos = 0;
  local_78.err = BSE_NO_ERROR;
  local_78.binarysource_ = &local_78;
  pVar3 = BinarySource_get_string(&local_78);
  _Var1 = ptrlen_eq_string(pVar3,key->vt->ssh_id);
  if (_Var1) {
    pVar3 = BinarySource_get_string(local_78.binarysource_);
    local_78.len = pVar3.len;
    local_78.data = pVar3.ptr;
    if ((local_78.binarysource_)->err == BSE_NO_ERROR) {
      ek = (eddsa_key *)(key + -3);
      local_78.pos = 0;
      local_78.err = BSE_NO_ERROR;
      local_78.binarysource_ = &local_78;
      pVar3 = BinarySource_get_data(&local_78,ek->curve->fieldBytes);
      pVar4 = BinarySource_get_data(local_78.binarysource_,ek->curve->fieldBytes);
      local_40 = pVar4.len;
      local_38 = pVar4.ptr;
      if ((((local_78.binarysource_)->err == BSE_NO_ERROR) &&
          ((local_78.binarysource_)->len == (local_78.binarysource_)->pos)) &&
         (local_48 = eddsa_decode(pVar3,ek->curve), local_48 != (EdwardsPoint *)0x0)) {
        pVar4.len = local_40;
        pVar4.ptr = local_38;
        n = mp_from_bytes_le(pVar4);
        n_00 = eddsa_signing_exponent_from_data(ek,extra,pVar3,data);
        P = ecc_edwards_multiply((EdwardsPoint *)(key[-3].vt)->public_blob,n);
        mp_free(n);
        Q = ecc_edwards_multiply((EdwardsPoint *)key[-2].vt,n_00);
        mp_free(n_00);
        ep = local_48;
        Q_00 = ecc_edwards_add(local_48,Q);
        ecc_edwards_point_free(Q);
        uVar2 = ecc_edwards_eq(P,Q_00);
        ecc_edwards_point_free(P);
        ecc_edwards_point_free(Q_00);
        ecc_edwards_point_free(ep);
        return uVar2 != 0;
      }
    }
  }
  return false;
}

Assistant:

static bool eddsa_verify(ssh_key *key, ptrlen sig, ptrlen data)
{
    struct eddsa_key *ek = container_of(key, struct eddsa_key, sshk);
    const struct ecsign_extra *extra =
        (const struct ecsign_extra *)ek->sshk.vt->extra;

    BinarySource src[1];
    BinarySource_BARE_INIT_PL(src, sig);

    /* Check the signature starts with the algorithm name */
    if (!ptrlen_eq_string(get_string(src), ek->sshk.vt->ssh_id))
        return false;

    /* Now expect a single string which is the concatenation of an
     * encoded curve point r and an integer s. */
    ptrlen sigstr = get_string(src);
    if (get_err(src))
        return false;
    BinarySource_BARE_INIT_PL(src, sigstr);
    ptrlen rstr = get_data(src, ek->curve->fieldBytes);
    ptrlen sstr = get_data(src, ek->curve->fieldBytes);
    if (get_err(src) || get_avail(src))
        return false;

    EdwardsPoint *r = eddsa_decode(rstr, ek->curve);
    if (!r)
        return false;
    mp_int *s = mp_from_bytes_le(sstr);

    mp_int *H = eddsa_signing_exponent_from_data(ek, extra, rstr, data);

    /* Verify that s*G == r + H*publicKey */
    EdwardsPoint *lhs = ecc_edwards_multiply(ek->curve->e.G, s);
    mp_free(s);
    EdwardsPoint *hpk = ecc_edwards_multiply(ek->publicKey, H);
    mp_free(H);
    EdwardsPoint *rhs = ecc_edwards_add(r, hpk);
    ecc_edwards_point_free(hpk);
    unsigned valid = ecc_edwards_eq(lhs, rhs);
    ecc_edwards_point_free(lhs);
    ecc_edwards_point_free(rhs);
    ecc_edwards_point_free(r);

    return valid;
}